

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
mxx::all2allv<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,mxx *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *msgs,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  size_type sVar1;
  const_iterator __first;
  const_iterator __last;
  unsigned_long uVar2;
  const_reference this_00;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *msgs_local;
  
  sVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     this);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs);
  uVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__last._M_current,0);
  if (sVar1 != uVar2) {
    assert_fail("msgs.size() == std::accumulate(send_sizes.begin(), send_sizes.end(), (size_t)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x533,"all2allv");
  }
  this_00 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       this,0);
  all2allv<std::pair<int,double>>
            (__return_storage_ptr__,(mxx *)this_00,(pair<int,_double> *)msgs,send_sizes,recv_sizes,
             comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2allv(const std::vector<T>& msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(msgs.size() == std::accumulate(send_sizes.begin(), send_sizes.end(), (size_t)0));
    return all2allv(&msgs[0], send_sizes, recv_sizes, comm);
}